

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testProcess.c
# Opt level: O0

int runChild(char **cmd,int state,int exception,int value,int share,int output,int delay,
            double timeout,int poll,int repeat,int disown)

{
  cmsysProcess *cp;
  cmsysProcess *kp;
  int result;
  double timeout_local;
  int output_local;
  int share_local;
  int value_local;
  int exception_local;
  int state_local;
  char **cmd_local;
  
  kp._4_4_ = 1;
  cp = cmsysProcess_New();
  if (cp == (cmsysProcess *)0x0) {
    fprintf(_stderr,"kwsysProcess_New returned NULL!\n");
    cmd_local._4_4_ = 1;
  }
  else {
    while (0 < repeat) {
      kp._4_4_ = runChild2(cp,cmd,state,exception,value,share,output,delay,timeout,poll,disown);
      repeat = repeat + -1;
    }
    cmsysProcess_Delete(cp);
    cmd_local._4_4_ = kp._4_4_;
  }
  return cmd_local._4_4_;
}

Assistant:

int runChild(const char* cmd[], int state, int exception, int value,
             int share, int output, int delay, double timeout,
             int poll, int repeat, int disown)
{
  int result = 1;
  kwsysProcess* kp = kwsysProcess_New();
  if(!kp)
    {
    fprintf(stderr, "kwsysProcess_New returned NULL!\n");
    return 1;
    }
  while(repeat-- > 0)
    {
    result = runChild2(kp, cmd, state, exception, value, share,
                       output, delay, timeout, poll, disown);
    }
  kwsysProcess_Delete(kp);
  return result;
}